

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

String * kj::_::operator*(String *__return_storage_ptr__,bool *param_2,undefined8 param_3,
                         undefined8 param_4,StringPtr *param_5)

{
  StringPtr *params;
  ArrayPtr<const_char> local_40;
  ArrayPtr<const_char> local_30;
  bool *local_20;
  DebugComparison<bool,_bool> *cmp_local;
  String *local_10;
  
  local_20 = param_2;
  local_10 = __return_storage_ptr__;
  local_30 = (ArrayPtr<const_char>)tryToCharSequence<bool,kj::StringPtr>(param_2);
  params = (StringPtr *)(local_20 + 8);
  local_40 = (ArrayPtr<const_char>)tryToCharSequence<bool,kj::StringPtr>(local_20 + 1);
  concat<kj::StringPtr,kj::StringPtr&,kj::StringPtr>
            (__return_storage_ptr__,(_ *)&local_30,params,(StringPtr *)&local_40,param_5);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}